

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O0

void fetch_radial_gradient(uint32_t *buffer,Operator *op,VSpanData *data,int y,int x,int length)

{
  bool bVar1;
  float *pfVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  uint32_t *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  float s;
  float s1;
  float s0;
  float detSqrt;
  uint32_t result;
  float det_1;
  float b_1;
  float gy;
  float gx;
  float invRw;
  float rw;
  float delta_delta_det;
  float delta_det;
  float det;
  float delta_rx_plus_ry;
  float rx_plus_ry;
  float delta_rxrxryry;
  float rxrxryry;
  float delta_bb;
  float bb;
  float delta_b_delta_b;
  float b_delta_b;
  float delta_b;
  float b;
  float delta_ry;
  float delta_rx;
  float inv_a;
  uint32_t *end;
  bool affine;
  float ry;
  float rx;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  uint32_t uVar11;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  float local_2c;
  float local_28;
  uint32_t *local_8;
  
  bVar1 = vIsZero(0.0);
  if (bVar1) {
    memfill32(in_RDI,0,in_R9D);
  }
  else {
    local_28 = *(float *)(in_RDX + 200) * ((float)in_R8D + 0.5) +
               *(float *)(in_RDX + 0xd4) * ((float)in_ECX + 0.5) + *(float *)(in_RDX + 0xe4);
    local_2c = *(float *)(in_RDX + 0xcc) * ((float)in_R8D + 0.5) +
               *(float *)(in_RDX + 0xd8) * ((float)in_ECX + 0.5) + *(float *)(in_RDX + 0xe8);
    bVar1 = false;
    if ((*(float *)(in_RDX + 0xd0) == 0.0) && (!NAN(*(float *)(in_RDX + 0xd0)))) {
      bVar1 = *(float *)(in_RDX + 0xdc) == 0.0;
    }
    if (bVar1) {
      local_28 = local_28 - *(float *)(in_RDX + 0x5c);
      local_2c = local_2c - *(float *)(in_RDX + 0x60);
      fVar3 = 1.0 / (*(float *)(in_RSI + 0x30) * 2.0);
      fVar8 = *(float *)(in_RDX + 200);
      fVar9 = *(float *)(in_RDX + 0xcc);
      fVar4 = (local_2c * *(float *)(in_RSI + 0x24) +
              *(float *)(in_RSI + 0x28) * *(float *)(in_RDX + 0x68) +
              local_28 * *(float *)(in_RSI + 0x20)) * 2.0;
      fVar5 = (fVar8 * *(float *)(in_RSI + 0x20) + fVar9 * *(float *)(in_RSI + 0x24)) * 2.0;
      fVar6 = fVar8 * fVar8 + fVar9 * fVar9;
      fVar7 = fVar6 * 2.0;
      fVar3 = fVar3 * fVar3;
      fetch((uint32_t *)
            CONCAT44(fVar7,(-(*(float *)(in_RSI + 0x30) * 4.0) *
                            (*(float *)(in_RSI + 0x2c) - (local_28 * local_28 + local_2c * local_2c)
                            ) + fVar4 * fVar4) * fVar3),
            (uint32_t *)
            CONCAT44((*(float *)(in_RSI + 0x30) * 4.0 *
                      ((local_28 * fVar8 + local_2c * fVar9) * 2.0 + fVar6) +
                     fVar4 * 2.0 * fVar5 + fVar5 * fVar5) * fVar3,
                     (*(float *)(in_RSI + 0x30) * 4.0 * fVar7 + fVar5 * 2.0 * fVar5) * fVar3),
            (Operator *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            (VSpanData *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
            in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
            in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    }
    else {
      fVar8 = *(float *)(in_RDX + 0xd0) * ((float)in_R8D + 0.5) +
              *(float *)(in_RDX + 0xdc) * ((float)in_ECX + 0.5) + *(float *)(in_RDX + 0xe0);
      for (local_8 = in_RDI; local_8 < in_RDI + in_R9D; local_8 = local_8 + 1) {
        if ((fVar8 != 0.0) || (NAN(fVar8))) {
          fVar9 = local_28 * (1.0 / fVar8) + -*(float *)(in_RDX + 0x5c);
          fVar4 = local_2c * (1.0 / fVar8) + -*(float *)(in_RDX + 0x60);
          fVar5 = (fVar4 * *(float *)(in_RSI + 0x24) +
                  *(float *)(in_RSI + 0x28) * *(float *)(in_RDX + 0x68) +
                  fVar9 * *(float *)(in_RSI + 0x20)) * 2.0;
          fVar9 = radialDeterminant(*(float *)(in_RSI + 0x30),fVar5,
                                    *(float *)(in_RSI + 0x2c) - (fVar9 * fVar9 + fVar4 * fVar4));
          uVar11 = 0;
          if (0.0 <= fVar9) {
            dVar10 = std::sqrt((double)(ulong)(uint)fVar9);
            fVar9 = (-fVar5 - SUB84(dVar10,0)) * *(float *)(in_RSI + 0x34);
            fVar4 = (-fVar5 + SUB84(dVar10,0)) * *(float *)(in_RSI + 0x34);
            pfVar2 = vMax<float>((float *)&stack0xffffffffffffff64,(float *)&stack0xffffffffffffff60
                                );
            if (0.0 <= *(float *)(in_RSI + 0x28) * *pfVar2 + *(float *)(in_RDX + 0x68)) {
              uVar11 = gradientPixel((VGradientData *)CONCAT44(fVar9,fVar4),*pfVar2);
            }
          }
          *local_8 = uVar11;
        }
        else {
          *local_8 = 0;
        }
        local_28 = *(float *)(in_RDX + 200) + local_28;
        local_2c = *(float *)(in_RDX + 0xcc) + local_2c;
        fVar8 = *(float *)(in_RDX + 0xd0) + fVar8;
      }
    }
  }
  return;
}

Assistant:

void fetch_radial_gradient(uint32_t *buffer, const Operator *op,
                           const VSpanData *data, int y, int x, int length)
{
    // avoid division by zero
    if (vIsZero(op->radial.a)) {
        memfill32(buffer, 0, length);
        return;
    }

    float rx =
        data->m21 * (y + float(0.5)) + data->dx + data->m11 * (x + float(0.5));
    float ry =
        data->m22 * (y + float(0.5)) + data->dy + data->m12 * (x + float(0.5));
    bool affine = !data->m13 && !data->m23;

    uint32_t *end = buffer + length;
    if (affine) {
        rx -= data->mGradient.radial.fx;
        ry -= data->mGradient.radial.fy;

        float inv_a = 1 / float(2 * op->radial.a);

        const float delta_rx = data->m11;
        const float delta_ry = data->m12;

        float b = 2 * (op->radial.dr * data->mGradient.radial.fradius +
                       rx * op->radial.dx + ry * op->radial.dy);
        float delta_b =
            2 * (delta_rx * op->radial.dx + delta_ry * op->radial.dy);
        const float b_delta_b = 2 * b * delta_b;
        const float delta_b_delta_b = 2 * delta_b * delta_b;

        const float bb = b * b;
        const float delta_bb = delta_b * delta_b;

        b *= inv_a;
        delta_b *= inv_a;

        const float rxrxryry = rx * rx + ry * ry;
        const float delta_rxrxryry = delta_rx * delta_rx + delta_ry * delta_ry;
        const float rx_plus_ry = 2 * (rx * delta_rx + ry * delta_ry);
        const float delta_rx_plus_ry = 2 * delta_rxrxryry;

        inv_a *= inv_a;

        float det =
            (bb - 4 * op->radial.a * (op->radial.sqrfr - rxrxryry)) * inv_a;
        float delta_det = (b_delta_b + delta_bb +
                           4 * op->radial.a * (rx_plus_ry + delta_rxrxryry)) *
                          inv_a;
        const float delta_delta_det =
            (delta_b_delta_b + 4 * op->radial.a * delta_rx_plus_ry) * inv_a;

        fetch(buffer, end, op, data, det, delta_det, delta_delta_det, b,
              delta_b);
    } else {
        float rw = data->m23 * (y + float(0.5)) + data->m33 +
                   data->m13 * (x + float(0.5));

        while (buffer < end) {
            if (rw == 0) {
                *buffer = 0;
            } else {
                float invRw = 1 / rw;
                float gx = rx * invRw - data->mGradient.radial.fx;
                float gy = ry * invRw - data->mGradient.radial.fy;
                float b = 2 * (op->radial.dr * data->mGradient.radial.fradius +
                               gx * op->radial.dx + gy * op->radial.dy);
                float det = radialDeterminant(
                    op->radial.a, b, op->radial.sqrfr - (gx * gx + gy * gy));

                uint32_t result = 0;
                if (det >= 0) {
                    float detSqrt = std::sqrt(det);

                    float s0 = (-b - detSqrt) * op->radial.inv2a;
                    float s1 = (-b + detSqrt) * op->radial.inv2a;

                    float s = vMax(s0, s1);

                    if (data->mGradient.radial.fradius + op->radial.dr * s >= 0)
                        result = gradientPixel(&data->mGradient, s);
                }

                *buffer = result;
            }

            rx += data->m11;
            ry += data->m12;
            rw += data->m13;

            ++buffer;
        }
    }
}